

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O1

int AF_A_CheckThrowBomb2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double *pdVar1;
  byte *pbVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  VM_UBYTE VVar6;
  AActor *this;
  undefined8 *puVar7;
  PClass *pPVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined8 uVar10;
  PClass *pPVar11;
  uint uVar12;
  FString *this_00;
  VMValue *pVVar13;
  char *__assertion;
  long lVar14;
  bool bVar15;
  VMValue params [3];
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b6767;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    this = (AActor *)(param->field_0).field_1.a;
    pVVar13 = param;
    uVar12 = numparam;
    if (this != (AActor *)0x0) {
      if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar9 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar9);
      }
      pPVar11 = (this->super_DThinker).super_DObject.Class;
      bVar15 = pPVar11 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar15;
      uVar12 = (uint)bVar15;
      pVVar13 = (VMValue *)(ulong)(pPVar11 == pPVar8 || bVar15);
      if (pPVar11 != pPVar8 && !bVar15) {
        do {
          pPVar11 = pPVar11->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar11 != (PClass *)0x0);
          if (pPVar11 == pPVar8) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b6767;
      }
    }
    pPVar8 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar6 = param[1].field_0.field_3.Type, VVar6 != 0xff)) {
      if ((VVar6 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b673c;
      puVar7 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar7 != (undefined8 *)0x0) {
        if (puVar7[1] == 0) {
          uVar10 = (**(code **)*puVar7)(puVar7,pVVar13,uVar12,ret);
          puVar7[1] = uVar10;
        }
        pPVar11 = (PClass *)puVar7[1];
        bVar15 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar8 && bVar15) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar15 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar8) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar15) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b6767;
        }
      }
    }
    if (((numparam < 3) || (VVar6 = param[2].field_0.field_3.Type, VVar6 == 0xff)) ||
       ((VVar6 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pdVar1 = &(this->Vel).Z;
      if ((*pdVar1 <= 2.0 && *pdVar1 != 2.0) &&
         (dVar3 = (this->Vel).X, dVar4 = (this->Vel).Y, dVar5 = (this->Vel).Z,
         dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3 < 2.25)) {
        AActor::SetState(this,this->SpawnState + 6,false);
        (this->__Pos).Z = this->floorz;
        (this->Vel).Z = 0.0;
        (this->BounceFlags).Value = 0;
        pbVar2 = (byte *)((long)&(this->flags).Value + 2);
        *pbVar2 = *pbVar2 & 0xfe;
      }
      local_68.field_1.atag = 1;
      local_68.field_3.Type = '\x03';
      local_50 = 1;
      local_4c = 3;
      local_48.Chars = (char *)0x0;
      local_40 = 8;
      local_3c[0] = 3;
      local_68.field_1.a = this;
      local_58 = this;
      VMFrameStack::Call(stack,&A_CheckThrowBomb_VMPtr->super_VMFunction,
                         (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
      lVar14 = -0x30;
      this_00 = &local_48;
      do {
        if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
          FString::~FString(this_00);
        }
        this_00 = this_00 + -2;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b673c:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b6767:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x1ba,"int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckThrowBomb2)
{
	PARAM_ACTION_PROLOGUE;

	// [RH] Check using actual velocity, although the vel.z < 2 check still stands
	if (self->Vel.Z < 2 && self->Vel.LengthSquared() < (9./4.))
	{
		self->SetState (self->SpawnState + 6);
		self->SetZ(self->floorz);
		self->Vel.Z = 0;
		self->BounceFlags = BOUNCE_None;
		self->flags &= ~MF_MISSILE;
	}
	CALL_ACTION(A_CheckThrowBomb, self);
	return 0;
}